

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultRawMemoryAllocator.cpp
# Opt level: O1

void * __thiscall
Diligent::DefaultRawMemoryAllocator::Allocate
          (DefaultRawMemoryAllocator *this,size_t Size,Char *dbgDescription,char *dbgFileName,
          Int32 dbgLineNumber)

{
  void *pvVar1;
  string msg;
  string local_30;
  
  if (Size == 0) {
    FormatString<char[26],char[9]>
              (&local_30,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x3663fc,
               (char (*) [9])dbgFileName);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/DefaultRawMemoryAllocator.cpp"
               ,0x51);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  pvVar1 = malloc(Size);
  return pvVar1;
}

Assistant:

void* DefaultRawMemoryAllocator::Allocate(size_t Size, const Char* dbgDescription, const char* dbgFileName, const Int32 dbgLineNumber)
{
    VERIFY_EXPR(Size > 0);
#ifdef USE_CRT_MALLOC_DBG
    return _malloc_dbg(Size, _NORMAL_BLOCK, dbgFileName, dbgLineNumber);
#else
    return malloc(Size);
#endif
}